

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_set_server_name(ptls_t *tls,char *server_name,size_t server_name_len)

{
  char *pcVar1;
  
  if (server_name == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    if (server_name_len == 0) {
      server_name_len = strlen(server_name);
    }
    pcVar1 = duplicate_as_str(server_name,server_name_len);
    if (pcVar1 == (char *)0x0) {
      return 0x201;
    }
  }
  free(tls->server_name);
  tls->server_name = pcVar1;
  return 0;
}

Assistant:

int ptls_set_server_name(ptls_t *tls, const char *server_name, size_t server_name_len)
{
    char *duped = NULL;

    if (server_name != NULL &&
        (duped = duplicate_as_str(server_name, server_name_len != 0 ? server_name_len : strlen(server_name))) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    free(tls->server_name);
    tls->server_name = duped;

    return 0;
}